

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  bool bVar2;
  long *aValue;
  JavascriptArray *array;
  Var pvVar3;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  aValue = (long *)GetReg<unsigned_int>(this,playout->Instance);
  bVar2 = TaggedNumber::Is(aValue);
  if ((bVar2) || (*aValue != VirtualTableInfo<Js::JavascriptArray>::Address)) {
    pvVar3 = GetReg<unsigned_int>(this,playout->Element);
    pvVar3 = JavascriptOperators::OP_GetElementI(aValue,pvVar3,*(ScriptContext **)(this + 0x78));
  }
  else {
    array = UnsafeVarTo<Js::JavascriptArray>(aValue);
    pvVar3 = GetReg<unsigned_int>(this,playout->Element);
    pvVar3 = ProfilingHelpers::ProfiledLdElem_FastPath
                       (array,pvVar3,*(ScriptContext **)(this + 0x78),(LdElemInfo *)0x0);
  }
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xef);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  SetReg<unsigned_int>(this,playout->Value,pvVar3);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetElementI(const unaligned T* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Same fast path as in the backend.

        Var instance = GetReg(playout->Instance);

        // Only enable fast path if the javascript array is not cross site
        Var element;
#if ENABLE_PROFILE_INFO
        if (!TaggedNumber::Is(instance) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(instance))
        {
            element =
                ProfilingHelpers::ProfiledLdElem_FastPath(
                    UnsafeVarTo<JavascriptArray>(instance),
                    GetReg(playout->Element),
                    GetScriptContext());
        }
        else
#endif
        {
            element = JavascriptOperators::OP_GetElementI(instance, GetReg(playout->Element), GetScriptContext());
        }

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->Value, element);
    }